

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

KeyValue<supermap::Key<4UL>,_unsigned_long> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
      *this,unsigned_long index)

{
  KeyValue<supermap::Key<4UL>,_unsigned_long> KVar1;
  InputIterator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_12UL,_void>
  local_90;
  _Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  local_80;
  undefined1 local_78 [56];
  string local_40;
  
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                  *)local_78);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_40,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
              *)this);
  std::filesystem::__cxx11::path::path((path *)(local_78 + 0x10),&local_40,auto_format);
  (**(code **)*(_func_int **)local_78._0_8_)(&local_80,local_78._0_8_,local_78 + 0x10,index * 0xc);
  local_90.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )local_80.super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl;
  local_90.index_ = 0;
  KVar1 = io::
          InputIterator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_12UL,_void>
          ::next(&local_90);
  if ((_Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
       )local_90.input_._M_t.
        super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
        .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl !=
      (InputStream *)0x0) {
    (**(code **)(*(long *)local_90.input_._M_t.
                          super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
                          .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl +
                0x18))();
  }
  local_90.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
          )0x0;
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x10));
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return KVar1;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }